

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_Parameters_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007951d8 == '\x01') {
    DAT_007951d8 = '\0';
    (*(code *)*_Int64Parameter_default_instance_)();
  }
  if (DAT_00795218 == '\x01') {
    DAT_00795218 = '\0';
    (*(code *)*_DoubleParameter_default_instance_)();
  }
  if (DAT_00795248 == '\x01') {
    DAT_00795248 = '\0';
    (*(code *)*_StringParameter_default_instance_)();
  }
  if (DAT_00795268 == '\x01') {
    DAT_00795268 = 0;
    (*(code *)*_BoolParameter_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Int64Parameter_default_instance_.Shutdown();
  _DoubleParameter_default_instance_.Shutdown();
  _StringParameter_default_instance_.Shutdown();
  _BoolParameter_default_instance_.Shutdown();
}